

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O0

ImPlotTick * __thiscall
ImPlotTickCollection::Append
          (ImPlotTickCollection *this,double value,bool major,bool show_label,char *fmt)

{
  int iVar1;
  size_t sVar2;
  ImPlotTick *pIVar3;
  char local_68;
  char acStack_67 [7];
  char temp [32];
  ImPlotTick tick;
  char *fmt_local;
  bool show_label_local;
  bool major_local;
  double value_local;
  ImPlotTickCollection *this_local;
  
  ImPlotTick::ImPlotTick((ImPlotTick *)(temp + 0x18),value,major,show_label);
  if ((show_label) && (fmt != (char *)0x0)) {
    iVar1 = ImGuiTextBuffer::size(&this->TextBuffer);
    snprintf(&local_68,0x20,fmt,temp._24_8_);
    sVar2 = strlen(&local_68);
    ImGuiTextBuffer::append(&this->TextBuffer,&local_68,acStack_67 + sVar2);
    ImGui::CalcTextSize((this->TextBuffer).Buf.Data + iVar1,(char *)0x0,false,-1.0);
  }
  pIVar3 = Append(this,(ImPlotTick *)(temp + 0x18));
  return pIVar3;
}

Assistant:

const ImPlotTick& Append(double value, bool major, bool show_label, const char* fmt) {
        ImPlotTick tick(value, major, show_label);
        if (show_label && fmt != NULL) {
            char temp[32];
            tick.TextOffset = TextBuffer.size();
            snprintf(temp, 32, fmt, tick.PlotPos);
            TextBuffer.append(temp, temp + strlen(temp) + 1);
            tick.LabelSize = ImGui::CalcTextSize(TextBuffer.Buf.Data + tick.TextOffset);
        }
        return Append(tick);
    }